

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O3

void gb_corrupt_wave_ram(gb_sound_t *gb)

{
  byte bVar1;
  uint uVar2;
  
  if ((gb->gbMode == '\0') && (gb->NoWaveCorrupt == '\0')) {
    bVar1 = (gb->snd_3).offset;
    uVar2 = (uint)(bVar1 >> 1);
    if (bVar1 < 8) {
      gb->snd_regs[0x20] = gb->snd_regs[(ulong)uVar2 + 0x20];
      return;
    }
    *(undefined4 *)(gb->snd_regs + 0x20) =
         *(undefined4 *)(gb->snd_regs + (ulong)(uVar2 & 0xfffffffc) + 0x20);
    return;
  }
  return;
}

Assistant:

static void gb_corrupt_wave_ram(gb_sound_t *gb)
{
	if (gb->gbMode != GBMODE_DMG || gb->NoWaveCorrupt)
		return;

	if (gb->snd_3.offset < 8)
	{
		gb->snd_regs[AUD3W0] = gb->snd_regs[AUD3W0 + (gb->snd_3.offset/2)];
	}
	else
	{
		int i;
		for (i = 0; i < 4; i++)
		{
			gb->snd_regs[AUD3W0 + i] = gb->snd_regs[AUD3W0 + ((gb->snd_3.offset / 2) & ~0x03) + i];
		}
	}
}